

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::vector(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
         *this,size_t count,optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *value,
        polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_> *alloc)

{
  undefined8 uVar1;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar2;
  size_t sVar3;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,count);
  if (count != 0) {
    poVar2 = this->ptr;
    sVar3 = count;
    do {
      poVar2->set = value->set;
      if (value->set == true) {
        (poVar2->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
        uVar1 = *(undefined8 *)((long)&value->optionalValue + 8);
        (poVar2->optionalValue).__align = (value->optionalValue).__align;
        *(undefined8 *)((long)&poVar2->optionalValue + 8) = uVar1;
      }
      poVar2 = poVar2 + 1;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  this->nStored = count;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }